

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32(CodedInputStream *this,uint32_t *value)

{
  byte bVar1;
  byte *pbVar2;
  int64_t iVar3;
  uint32_t first_byte_or_zero;
  
  pbVar2 = this->buffer_;
  if (pbVar2 < this->buffer_end_) {
    bVar1 = *pbVar2;
    first_byte_or_zero = (uint32_t)bVar1;
    if (-1 < (char)bVar1) {
      *value = (uint)bVar1;
      this->buffer_ = pbVar2 + 1;
      return true;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  iVar3 = ReadVarint32Fallback(this,first_byte_or_zero);
  *value = (uint32_t)iVar3;
  return -1 < iVar3;
}

Assistant:

inline bool CodedInputStream::ReadVarint32(uint32_t* value) {
  uint32_t v = 0;
  if (PROTOBUF_PREDICT_TRUE(buffer_ < buffer_end_)) {
    v = *buffer_;
    if (v < 0x80) {
      *value = v;
      Advance(1);
      return true;
    }
  }
  int64_t result = ReadVarint32Fallback(v);
  *value = static_cast<uint32_t>(result);
  return result >= 0;
}